

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.cpp
# Opt level: O2

void __thiscall EditDistance::updateDpMatrix(EditDistance *this,int upperBound)

{
  bool bVar1;
  int i;
  int j;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int i_1;
  int iVar7;
  
  lVar5 = 0;
  iVar6 = 0;
  iVar7 = 0;
  for (lVar2 = 0; uVar3 = (ulong)this->seqSize, lVar2 < (long)uVar3; lVar2 = lVar2 + 1) {
    bVar1 = IntView<0>::indomain((IntView<0> *)((long)&this->seq1->var + lVar5),0);
    iVar7 = iVar7 + (uint)bVar1;
    bVar1 = IntView<0>::indomain((IntView<0> *)((long)&this->seq2->var + lVar5),0);
    iVar6 = iVar6 + (uint)bVar1;
    lVar5 = lVar5 + 0x10;
  }
  if (iVar6 < iVar7) {
    iVar6 = iVar7;
  }
  iVar6 = iVar6 + upperBound / this->min_id_cost;
  for (iVar7 = 0; iVar7 <= (int)uVar3; iVar7 = iVar7 + 1) {
    j = iVar7 - iVar6;
    if (iVar7 - iVar6 < 1) {
      j = 0;
    }
    uVar4 = uVar3 & 0xffffffff;
    if (iVar7 + iVar6 < (int)uVar3) {
      uVar4 = (ulong)(uint)(iVar7 + iVar6);
    }
    for (; j <= (int)uVar4; j = j + 1) {
      updateDpPosition(this,iVar7,j,iVar6);
    }
    uVar3 = (ulong)(uint)this->seqSize;
  }
  return;
}

Assistant:

void updateDpMatrix(int upperBound) {
		//
		// First update regular matrix
		//

		// count num possible 0 insertions
		int possible_0_inserts = 0;
		int possible_0_deletes = 0;
		for (int i = 0; i < seqSize; i++) {
			if (seq1[i].indomain(0)) {
				possible_0_inserts++;
			}
			if (seq2[i].indomain(0)) {
				possible_0_deletes++;
			}
		}

		// d = distance to diagonal that should be calculated in the matrix
		const int d = upperBound / min_id_cost + std::max(possible_0_inserts, possible_0_deletes);

#ifndef NDEBUG
		std::cout << "d = " << d << '\n';
#endif

		for (int i = 0; i < seqSize + 1; i++) {
			const int startCol = std::max(0, i - d);
			const int endCol = std::min(seqSize, i + d);
			for (int j = startCol; j < endCol + 1; j++) {
				updateDpPosition(i, j, d);
			}
		}
	}